

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<double>::AddKel
          (TPZMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  int64_t iVar1;
  long lVar2;
  int64_t iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double prevval;
  double local_68;
  TPZVec<long> *local_60;
  TPZVec<long> *local_58;
  long local_50;
  long local_48;
  TPZFMatrix<double> *local_40;
  long local_38;
  
  lVar6 = source->fNElements;
  local_60 = source;
  local_58 = destinationindex;
  local_40 = elmat;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_48 = 0;
  if (0 < lVar6) {
    local_48 = lVar6;
  }
  local_38 = lVar6;
  if (iVar4 == 0) {
    for (local_50 = 0; local_50 != local_48; local_50 = local_50 + 1) {
      lVar6 = local_58->fStore[local_50];
      iVar1 = local_60->fStore[local_50];
      for (lVar7 = 0; local_38 != lVar7; lVar7 = lVar7 + 1) {
        lVar2 = local_58->fStore[lVar7];
        iVar3 = local_60->fStore[lVar7];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar2);
        local_68 = extraout_XMM0_Qa_00;
        pdVar5 = TPZFMatrix<double>::operator()(local_40,iVar1,iVar3);
        local_68 = *pdVar5 + local_68;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar2,&local_68);
      }
    }
  }
  else {
    lVar6 = 0;
    while (lVar6 != local_48) {
      lVar7 = local_58->fStore[lVar6];
      iVar1 = local_60->fStore[lVar6];
      local_50 = lVar6;
      for (; local_38 != lVar6; lVar6 = lVar6 + 1) {
        lVar2 = local_58->fStore[lVar6];
        iVar3 = local_60->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar2);
        local_68 = extraout_XMM0_Qa;
        pdVar5 = TPZFMatrix<double>::operator()(local_40,iVar1,iVar3);
        local_68 = *pdVar5 + local_68;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar2,&local_68);
      }
      lVar6 = local_50 + 1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}